

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_hmac_starts(mbedtls_md_context_t *ctx,uchar *key,size_t keylen)

{
  uchar *__s;
  int iVar1;
  size_t sVar2;
  size_t __n;
  uchar *input;
  uchar sum [64];
  uchar local_78 [72];
  
  if (ctx == (mbedtls_md_context_t *)0x0) {
    return -0x5100;
  }
  if (ctx->md_info == (mbedtls_md_info_t *)0x0) {
    return -0x5100;
  }
  input = (uchar *)ctx->hmac_ctx;
  if (input == (uchar *)0x0) {
    return -0x5100;
  }
  __n = (size_t)ctx->md_info->block_size;
  if (__n < keylen) {
    iVar1 = mbedtls_md_starts(ctx);
    if (((iVar1 != 0) || (iVar1 = mbedtls_md_update(ctx,key,keylen), iVar1 != 0)) ||
       (iVar1 = mbedtls_md_finish(ctx,local_78), iVar1 != 0)) goto LAB_00130c20;
    input = (uchar *)ctx->hmac_ctx;
    keylen = (size_t)ctx->md_info->size;
    __n = (size_t)ctx->md_info->block_size;
    key = local_78;
  }
  __s = input + __n;
  memset(input,0x36,__n);
  memset(__s,0x5c,(ulong)ctx->md_info->block_size);
  if (keylen != 0) {
    sVar2 = 0;
    do {
      input[sVar2] = input[sVar2] ^ key[sVar2];
      __s[sVar2] = __s[sVar2] ^ key[sVar2];
      sVar2 = sVar2 + 1;
    } while (keylen != sVar2);
  }
  iVar1 = mbedtls_md_starts(ctx);
  if (iVar1 == 0) {
    iVar1 = mbedtls_md_update(ctx,input,(ulong)ctx->md_info->block_size);
  }
LAB_00130c20:
  mbedtls_platform_zeroize(local_78,0x40);
  return iVar1;
}

Assistant:

int mbedtls_md_hmac_starts( mbedtls_md_context_t *ctx, const unsigned char *key, size_t keylen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char sum[MBEDTLS_MD_MAX_SIZE];
    unsigned char *ipad, *opad;
    size_t i;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( keylen > (size_t) ctx->md_info->block_size )
    {
        if( ( ret = mbedtls_md_starts( ctx ) ) != 0 )
            goto cleanup;
        if( ( ret = mbedtls_md_update( ctx, key, keylen ) ) != 0 )
            goto cleanup;
        if( ( ret = mbedtls_md_finish( ctx, sum ) ) != 0 )
            goto cleanup;

        keylen = ctx->md_info->size;
        key = sum;
    }

    ipad = (unsigned char *) ctx->hmac_ctx;
    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    memset( ipad, 0x36, ctx->md_info->block_size );
    memset( opad, 0x5C, ctx->md_info->block_size );

    for( i = 0; i < keylen; i++ )
    {
        ipad[i] = (unsigned char)( ipad[i] ^ key[i] );
        opad[i] = (unsigned char)( opad[i] ^ key[i] );
    }

    if( ( ret = mbedtls_md_starts( ctx ) ) != 0 )
        goto cleanup;
    if( ( ret = mbedtls_md_update( ctx, ipad,
                                   ctx->md_info->block_size ) ) != 0 )
        goto cleanup;

cleanup:
    mbedtls_platform_zeroize( sum, sizeof( sum ) );

    return( ret );
}